

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

RK_S32 mpi_dec_opt_h(void *ctx,char *next)

{
  int iVar1;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","invalid input height\n",0);
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x20c) = iVar1;
  }
  return (uint)(next != (char *)0x0);
}

Assistant:

RK_S32 mpi_dec_opt_h(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        cmd->height = atoi(next);
        return 1;
    }

    mpp_err("invalid input height\n");
    return 0;
}